

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::ConcatStringBuilder::CopyVirtual
          (ConcatStringBuilder *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  code *pcVar1;
  StringCopyInfo copyInfo;
  StringCopyInfoStack *this_00;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<Js::JavascriptString> **ppWVar5;
  JavascriptString **ppJVar6;
  ConcatStringBuilder **ppCVar7;
  StringCopyInfo local_60;
  charcount_t local_44;
  JavascriptString *pJStack_40;
  CharCount copyCharLength;
  JavascriptString *s;
  ConcatStringBuilder *pCStack_30;
  int i;
  ConcatStringBuilder *current;
  CharCount remainingCharLengthToCopy;
  byte recursionDepth_local;
  StringCopyInfoStack *nestedStringTreeCopyInfos_local;
  char16 *buffer_local;
  ConcatStringBuilder *this_local;
  
  current._7_1_ = recursionDepth;
  _remainingCharLengthToCopy = nestedStringTreeCopyInfos;
  nestedStringTreeCopyInfos_local = (StringCopyInfoStack *)buffer;
  buffer_local = (char16 *)this;
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x1da,"(!this->IsFinalized())","!this->IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (nestedStringTreeCopyInfos_local == (StringCopyInfoStack *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x1db,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  current._0_4_ = JavascriptString::GetLength((JavascriptString *)this);
  pCStack_30 = this;
  do {
    if (pCStack_30 == (ConcatStringBuilder *)0x0) {
      return;
    }
    s._4_4_ = pCStack_30->m_count;
    while (s._4_4_ = s._4_4_ + -1, -1 < s._4_4_) {
      ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                          ((WriteBarrierPtr *)&pCStack_30->m_slots);
      ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                          ((WriteBarrierPtr *)(*ppWVar5 + s._4_4_));
      pJStack_40 = *ppJVar6;
      if (pJStack_40 != (JavascriptString *)0x0) {
        local_44 = JavascriptString::GetLength(pJStack_40);
        if ((uint)current < local_44) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,0x1e9,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        current._0_4_ = (uint)current - local_44;
        if ((current._7_1_ == 3) &&
           (uVar3 = (*(pJStack_40->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(),
           this_00 = _remainingCharLengthToCopy, (uVar3 & 1) != 0)) {
          StringCopyInfo::StringCopyInfo
                    (&local_60,pJStack_40,
                     (char16 *)
                     ((long)&nestedStringTreeCopyInfos_local->scriptContext +
                     (ulong)(uint)current * 2));
          copyInfo.destinationBuffer = local_60.destinationBuffer;
          copyInfo.sourceString = local_60.sourceString;
          copyInfo.isInitialized = local_60.isInitialized;
          copyInfo._17_7_ = local_60._17_7_;
          StringCopyInfoStack::Push(this_00,copyInfo);
        }
        else {
          if (3 < current._7_1_) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,500,"(recursionDepth <= MaxCopyRecursionDepth)",
                                        "recursionDepth <= MaxCopyRecursionDepth");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          JavascriptString::Copy
                    (pJStack_40,
                     (char16 *)
                     ((long)&nestedStringTreeCopyInfos_local->scriptContext +
                     (ulong)(uint)current * 2),_remainingCharLengthToCopy,current._7_1_ + 1);
        }
      }
    }
    ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_ConcatStringBuilder__
                        ((WriteBarrierPtr *)&pCStack_30->m_prevChunk);
    pCStack_30 = *ppCVar7;
  } while( true );
}

Assistant:

void ConcatStringBuilder::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!this->IsFinalized());
        Assert(buffer);

        CharCount remainingCharLengthToCopy = GetLength();
        for(const ConcatStringBuilder *current = this; current; current = current->m_prevChunk)
        {
            for(int i = current->m_count - 1; i >= 0; --i)
            {
                JavascriptString *const s = current->m_slots[i];
                if(!s)
                {
                    continue;
                }

                const CharCount copyCharLength = s->GetLength();
                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }
    }